

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
set<std::initializer_list<wasm::Expression*>>
          (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *this,
          initializer_list<wasm::Expression_*> *list)

{
  size_type size_00;
  const_iterator ppEVar1;
  Expression *elem;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<wasm::Expression_*> *__range2;
  size_t i;
  size_t size;
  initializer_list<wasm::Expression_*> *list_local;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_local;
  
  size_00 = std::initializer_list<wasm::Expression_*>::size(list);
  if (*(ulong *)(this + 0x10) < size_00) {
    ArenaVector<wasm::Expression_*>::allocate((ArenaVector<wasm::Expression_*> *)this,size_00);
  }
  __range2 = (initializer_list<wasm::Expression_*> *)0x0;
  __end0 = std::initializer_list<wasm::Expression_*>::begin(list);
  ppEVar1 = std::initializer_list<wasm::Expression_*>::end(list);
  for (; __end0 != ppEVar1; __end0 = __end0 + 1) {
    *(Expression **)(*(long *)this + (long)__range2 * 8) = *__end0;
    __range2 = (initializer_list<wasm::Expression_*> *)((long)&__range2->_M_array + 1);
  }
  *(size_type *)(this + 8) = size_00;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }